

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_ad097::PercentTotalKernel::aggregate
          (PercentTotalKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  Config *pCVar1;
  Node *pNVar2;
  pointer pEVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  cali_id_t cVar6;
  cali_id_t cVar7;
  pointer pEVar8;
  double dVar9;
  Attribute sum_attr;
  Attribute percentage_attr;
  cali_id_t local_50;
  Attribute local_40;
  Attribute local_38;
  
  pCVar1 = this->m_config;
  if ((pCVar1->m_target_attr).m_node == (Node *)0x0) {
    iVar5 = (*db->_vptr_CaliperMetadataAccessInterface[2])(db,&pCVar1->m_target_attr_name);
    (pCVar1->m_target_attr).m_node = (Node *)CONCAT44(extraout_var,iVar5);
  }
  pNVar2 = (pCVar1->m_target_attr).m_node;
  local_38.m_node = (Node *)0x0;
  local_40.m_node = (Node *)0x0;
  bVar4 = Config::get_percentage_attribute(this->m_config,db,&local_38,&local_40);
  if (bVar4) {
    local_50 = 0xffffffffffffffff;
    cVar7 = 0xffffffffffffffff;
    if (pNVar2 != (Node *)0x0) {
      cVar7 = pNVar2->m_id;
    }
    if (local_40.m_node != (Node *)0x0) {
      local_50 = (local_40.m_node)->m_id;
    }
    pEVar3 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar8 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
                  super__Vector_impl_data._M_start; pEVar8 != pEVar3; pEVar8 = pEVar8 + 1) {
      pNVar2 = pEVar8->m_node;
      if (pNVar2 == (Node *)0x0) {
        cVar6 = 0xffffffffffffffff;
      }
      else {
        cVar6 = pNVar2->m_attribute;
        if (cVar6 == 8) {
          cVar6 = pNVar2->m_id;
        }
      }
      if ((cVar6 == cVar7) || (cVar6 == local_50)) {
        dVar9 = cali_variant_to_double((pEVar8->m_value).m_v,(_Bool *)0x0);
        this->m_sum = this->m_sum + dVar9;
        this->m_isum = this->m_isum + dVar9;
        pCVar1 = this->m_config;
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&pCVar1->m_total_lock);
        if (iVar5 != 0) {
          std::__throw_system_error(iVar5);
        }
        pCVar1->m_total = dVar9 + pCVar1->m_total;
        pthread_mutex_unlock((pthread_mutex_t *)&pCVar1->m_total_lock);
      }
    }
  }
  return;
}

Assistant:

void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        Attribute target_attr = m_config->get_target_attr(db);
        Attribute percentage_attr, sum_attr;

        if (!m_config->get_percentage_attribute(db, percentage_attr, sum_attr))
            return;

        cali_id_t target_id = target_attr.id();
        cali_id_t sum_id    = sum_attr.id();

        for (const Entry& e : list) {
            cali_id_t id = e.attribute();

            if (id == target_id || id == sum_id) {
                double val = e.value().to_double();
                m_sum += val;
                m_isum += val;
                m_config->add(val);
            }
        }
    }